

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,assertion_fail<bool> assertion)

{
  string_view name;
  printer *ppVar1;
  printer *this_00;
  printer *this_01;
  long in_RDI;
  anon_class_1_0_00000001 short_name;
  char *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffff98) [4];
  printer *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *t;
  printer *in_stack_ffffffffffffffb0;
  
  t = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
  ppVar1 = printer::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  reflection::source_location::file_name((source_location *)&t->_M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa0,
             *in_stack_ffffffffffffff98);
  name._M_str = in_stack_ffffffffffffff90;
  name._M_len = (size_t)ppVar1;
  on<bool>::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)0x10edcd,name);
  printer::operator<<(in_stack_ffffffffffffffb0,t);
  printer::operator<<(in_stack_ffffffffffffffa0,*in_stack_ffffffffffffff98);
  reflection::source_location::line((source_location *)&t->_M_str);
  printer::operator<<(in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  ppVar1 = printer::operator<<(in_stack_ffffffffffffffa0,*in_stack_ffffffffffffff98);
  printer::colors((printer *)(in_RDI + 0x30));
  printer::operator<<(in_stack_ffffffffffffffb0,t);
  this_00 = printer::operator<<(in_stack_ffffffffffffffa0,(char (*) [7])ppVar1);
  printer::colors((printer *)(in_RDI + 0x30));
  printer::operator<<(in_stack_ffffffffffffffb0,t);
  printer::operator<<(this_00,(char (*) [3])ppVar1);
  printer::operator<<(this_00,(_func_ios_base_ptr_ios_base_ptr *)ppVar1);
  this_01 = printer::operator<<(this_00,(bool *)ppVar1);
  printer::colors((printer *)(in_RDI + 0x30));
  printer::operator<<(this_01,t);
  printer::operator<<(this_00,(char *)ppVar1);
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }